

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void push_heap_suite::push_decreasing_predicate(void)

{
  array<int,_4UL> *paVar1;
  int *piVar2;
  int local_58;
  undefined8 local_54;
  undefined4 local_4c;
  array<int,_4UL> expect;
  int local_38 [2];
  
  local_4c = 0;
  local_54 = 0;
  local_58 = 0x2c;
  vista::push_heap<false,int*,std::greater<int>>(&local_58);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  paVar1 = &expect;
  piVar2 = local_38;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xc4,"void push_heap_suite::push_decreasing_predicate()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  local_54 = CONCAT44(local_54._4_4_,0x21);
  vista::push_heap<false,int*,std::greater<int>>(&local_58,(long)&local_54 + 4,piVar2,paVar1);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  paVar1 = &expect;
  piVar2 = local_38;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xcb,"void push_heap_suite::push_decreasing_predicate()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  local_54 = CONCAT44(0x16,(undefined4)local_54);
  vista::push_heap<false,int*,std::greater<int>>(&local_58,&local_4c,piVar2,paVar1);
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xd2,"void push_heap_suite::push_decreasing_predicate()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  local_4c = 0xb;
  vista::push_heap<false,int*,std::greater<int>>(&local_58,&expect);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xd9,"void push_heap_suite::push_decreasing_predicate()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  return;
}

Assistant:

void push_decreasing_predicate()
{
    std::array<int, 4> heap = {};
    auto last = heap.begin();
    *last++ = 44;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 44, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 33, 44, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 22, 44, 33, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 11;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}